

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1ab06b7::WriteFilesArgument
          (anon_unknown_dwarf_1ab06b7 *this,ostream *os,string_view *keyword,
          vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
          *items,string *config,cmScriptGeneratorIndent indent)

{
  size_type sVar1;
  ostream *poVar2;
  bool bVar3;
  cmScriptGeneratorIndent cVar4;
  char *pcVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> result;
  size_type *local_180;
  size_type local_170;
  undefined8 uStack_168;
  char local_160;
  long *local_158 [2];
  long local_148 [2];
  long *local_138;
  undefined8 local_130;
  long local_128 [2];
  ostream *local_118;
  char *local_110;
  string local_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_e8;
  undefined8 local_d0;
  long *local_c8;
  long **local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  char local_50 [32];
  
  local_158[0] = local_148;
  local_118 = os;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_158,items,
             (long)&(config->_M_dataplus)._M_p +
             (long)&(items->
                    super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
                    )._M_impl);
  pcVar5 = (char *)keyword->_M_len;
  local_110 = keyword->_M_str;
  if (pcVar5 != local_110) {
    bVar3 = true;
    do {
      (**(code **)(**(long **)pcVar5 + 0x10))(&local_138,*(long **)pcVar5,local_158);
      local_68 = 0;
      local_60 = 1;
      local_e8.first._M_str = local_50;
      local_50[0] = '\"';
      local_e8.first._M_len = 1;
      local_e8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_d0 = local_130;
      local_c8 = local_138;
      local_a0 = 0;
      local_98 = 1;
      local_b0 = local_88;
      local_88[0] = 0x22;
      local_b8 = 1;
      local_a8 = 0;
      views._M_len = 3;
      views._M_array = &local_e8;
      local_c0 = &local_138;
      local_90 = local_b0;
      local_58 = local_e8.first._M_str;
      cmCatViews(&local_108,views);
      if (local_138 != local_128) {
        operator_delete(local_138,local_128[0] + 1);
      }
      sVar1 = local_108._M_string_length;
      local_180 = &local_170;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        uStack_168 = local_108.field_2._8_8_;
      }
      else {
        local_180 = (size_type *)local_108._M_dataplus._M_p;
      }
      local_170 = local_108.field_2._M_allocated_capacity;
      local_160 = '\x01';
      if (bVar3) {
        cVar4.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
            cVar4.Level = cVar4.Level + -1;
          } while (cVar4.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  ",2);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this,*(char **)&local_118->field_0x8,
                            (long)local_118->_vptr_basic_ostream);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      cVar4.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
          cVar4.Level = cVar4.Level + -1;
        } while (cVar4.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"    ",4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this,(char *)local_180,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((local_160 == '\x01') && (local_160 = '\0', local_180 != &local_170)) {
        operator_delete(local_180,local_170 + 1);
      }
      pcVar5 = pcVar5 + 8;
      bVar3 = false;
    } while (pcVar5 != local_110);
  }
  if (local_158[0] != local_148) {
    operator_delete(local_158[0],local_148[0] + 1);
  }
  return;
}

Assistant:

void WriteFilesArgument(
  std::ostream& os, const cm::string_view& keyword,
  const std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item>>&
    items,
  const std::string& config, cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, items, indent,
    [config](const std::unique_ptr<cmInstallRuntimeDependencySet::Item>& i)
      -> std::string { return cmStrCat('"', i->GetItemPath(config), '"'); });
}